

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules(cmMakefileLibraryTargetGenerator *this)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  char *val;
  string local_158;
  undefined1 local_138 [8];
  string extraFlags;
  string linkRuleVar;
  string linkLanguage;
  undefined1 local_d0 [8];
  string linkRuleVar_1;
  string local_a8;
  char *local_88;
  char *resolveDeviceSymbols;
  const_iterator cStack_78;
  bool doDeviceLinking;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  byte local_51;
  LinkClosure *pLStack_50;
  bool hasCUDA;
  LinkClosure *closure;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string cuda_lang;
  cmMakefileLibraryTargetGenerator *this_local;
  
  cuda_lang.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"CUDA",&local_31);
  std::allocator<char>::~allocator(&local_31);
  pLStack_50 = cmGeneratorTarget::GetLinkClosure
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget,
                          &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                           ConfigName);
  local_68._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&pLStack_50->Languages);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&pLStack_50->Languages);
  local_60 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_68,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_70,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_30);
  cStack_78 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&pLStack_50->Languages);
  local_51 = __gnu_cxx::operator!=(&local_60,&stack0xffffffffffffff88);
  resolveDeviceSymbols._7_1_ = 0;
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CUDA_RESOLVE_DEVICE_SYMBOLS",
             (allocator<char> *)(linkRuleVar_1.field_2._M_local_buf + 0xf));
  val = cmGeneratorTarget::GetProperty(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(linkRuleVar_1.field_2._M_local_buf + 0xf));
  local_88 = val;
  if (val != (char *)0x0) {
    resolveDeviceSymbols._7_1_ = cmSystemTools::IsOn(val);
  }
  if (((local_51 & 1) != 0) && ((resolveDeviceSymbols._7_1_ & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",
               (allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf));
    WriteDeviceLibraryRules(this,(string *)local_d0,false);
    std::__cxx11::string::~string((string *)local_d0);
  }
  cmGeneratorTarget::GetLinkerLanguage
            ((string *)((long)&linkRuleVar.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  cmGeneratorTarget::GetCreateRuleVariable
            ((string *)((long)&extraFlags.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             (string *)((long)&linkRuleVar.field_2 + 8),
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::__cxx11::string::string((string *)local_138);
  this_01 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmsys::SystemTools::UpperCase
            (&local_158,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  cmLocalGenerator::GetStaticLibraryFlags
            ((cmLocalGenerator *)this_01,(string *)local_138,&local_158,
             (string *)((long)&linkRuleVar.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&local_158);
  WriteLibraryRules(this,(string *)((long)&extraFlags.field_2 + 8),(string *)local_138,false);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)(extraFlags.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules()
{
  const std::string cuda_lang("CUDA");
  cmGeneratorTarget::LinkClosure const* closure =
    this->GeneratorTarget->GetLinkClosure(this->ConfigName);

  const bool hasCUDA =
    (std::find(closure->Languages.begin(), closure->Languages.end(),
               cuda_lang) != closure->Languages.end());

  bool doDeviceLinking = false;
  if (const char* resolveDeviceSymbols =
        this->GeneratorTarget->GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
    doDeviceLinking = cmSystemTools::IsOn(resolveDeviceSymbols);
  }
  if (hasCUDA && doDeviceLinking) {
    std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
    this->WriteDeviceLibraryRules(linkRuleVar, false);
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);

  std::string linkRuleVar = this->GeneratorTarget->GetCreateRuleVariable(
    linkLanguage, this->ConfigName);

  std::string extraFlags;
  this->LocalGenerator->GetStaticLibraryFlags(
    extraFlags, cmSystemTools::UpperCase(this->ConfigName), linkLanguage,
    this->GeneratorTarget);
  this->WriteLibraryRules(linkRuleVar, extraFlags, false);
}